

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O3

void __thiscall ALSAMidiDriver::start(ALSAMidiDriver *this)

{
  QDebug this_00;
  int iVar1;
  QByteArrayView QVar2;
  QDebug local_60;
  QArrayData *local_58 [3];
  QObject local_40 [8];
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  OSSMidiPortDriver::start(&this->rawMidiPortDriver);
  QObject::connect(local_40,(char *)this,
                   (QObject *)"2mainWindowTitleContributionUpdated(const QString &)",
                   (char *)(this->super_MidiDriver).master,0x192601);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  iVar1 = alsa_setup_midi(this);
  if (-1 < iVar1) {
    this->stopProcessing = false;
    iVar1 = pthread_create(&this->processingThreadID,(pthread_attr_t *)0x0,processingThread,this);
    if (iVar1 != 0) {
      this->processingThreadID = 0;
      local_38 = 2;
      local_34 = 0;
      uStack_2c = 0;
      local_24 = 0;
      local_20 = "default";
      QMessageLogger::debug();
      this_00.stream = local_60.stream;
      QVar2.m_data = (storage_type *)0x32;
      QVar2.m_size = (qsizetype)local_58;
      QString::fromUtf8(QVar2);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_58);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,8);
        }
      }
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_60.stream,iVar1);
      if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
      }
      QDebug::~QDebug(&local_60);
      snd_seq_close(this->snd_seq);
    }
  }
  return;
}

Assistant:

void ALSAMidiDriver::start() {
	rawMidiPortDriver.start();
	connect(this, SIGNAL(mainWindowTitleContributionUpdated(const QString &)), master, SLOT(updateMainWindowTitleContribution(const QString &)));
	if (alsa_setup_midi() < 0) return;
	stopProcessing = false;
	int error = pthread_create(&processingThreadID, NULL, processingThread, this);
	if (error != 0) {
		processingThreadID = 0;
		qDebug() << "ALSAMidiDriver: Processing Thread creation failed:" << error;
		snd_seq_close(snd_seq);
	}
}